

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O2

Status __thiscall spvtools::opt::ReplaceInvalidOpcodePass::Process(ReplaceInvalidOpcodePass *this)

{
  Module *pMVar1;
  pointer puVar2;
  bool bVar3;
  ExecutionModel model;
  FeatureManager *pFVar4;
  Status SVar5;
  pointer puVar6;
  byte bVar7;
  
  pFVar4 = IRContext::get_feature_mgr((this->super_Pass).context_);
  bVar3 = EnumSet<spv::Capability>::contains(&pFVar4->capabilities_,CapabilityLinkage);
  SVar5 = SuccessWithoutChange;
  if (!bVar3) {
    model = GetExecutionModel(this);
    if ((model != ExecutionModelKernel) && (model != ExecutionModelMax)) {
      pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      puVar2 = *(pointer *)
                ((long)&(pMVar1->functions_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                + 8);
      bVar7 = 0;
      for (puVar6 = *(pointer *)
                     &(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                      ._M_impl; puVar6 != puVar2; puVar6 = puVar6 + 1) {
        bVar3 = RewriteFunction(this,(Function *)
                                     (puVar6->_M_t).
                                     super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                ,model);
        bVar7 = bVar7 | bVar3;
      }
      SVar5 = bVar7 ^ SuccessWithoutChange;
    }
  }
  return SVar5;
}

Assistant:

Pass::Status ReplaceInvalidOpcodePass::Process() {
  bool modified = false;

  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Linkage)) {
    return Status::SuccessWithoutChange;
  }

  spv::ExecutionModel execution_model = GetExecutionModel();
  if (execution_model == spv::ExecutionModel::Kernel) {
    // We do not handle kernels.
    return Status::SuccessWithoutChange;
  }
  if (execution_model == spv::ExecutionModel::Max) {
    // Mixed execution models for the entry points.  This case is not currently
    // handled.
    return Status::SuccessWithoutChange;
  }

  for (Function& func : *get_module()) {
    modified |= RewriteFunction(&func, execution_model);
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}